

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int doMount(PHYSFS_Io *io,char *fname,char *mountPoint,int appendToPath)

{
  int iVar1;
  DirHandle *pDVar2;
  __PHYSFS_DIRHANDLE__ **pp_Var3;
  DirHandle *pDVar4;
  char *mountPoint_00;
  int iVar5;
  
  mountPoint_00 = "/";
  if (mountPoint != (char *)0x0) {
    mountPoint_00 = mountPoint;
  }
  __PHYSFS_platformGrabMutex(stateLock);
  iVar5 = 0;
  pDVar2 = searchPath;
  if (searchPath == (DirHandle *)0x0) {
    pDVar4 = (DirHandle *)0x0;
  }
  else {
    do {
      pDVar4 = pDVar2;
      if ((pDVar4->dirName != (char *)0x0) && (iVar1 = strcmp(fname,pDVar4->dirName), iVar1 == 0))
      goto LAB_00107ed1;
      pDVar2 = pDVar4->next;
    } while (pDVar4->next != (__PHYSFS_DIRHANDLE__ *)0x0);
  }
  pDVar2 = createDirHandle(io,fname,mountPoint_00,0);
  if (pDVar2 != (DirHandle *)0x0) {
    if (appendToPath == 0) {
      pDVar2->next = searchPath;
      pp_Var3 = &searchPath;
    }
    else {
      pp_Var3 = &searchPath;
      if (pDVar4 != (DirHandle *)0x0) {
        pp_Var3 = &pDVar4->next;
      }
    }
    *pp_Var3 = pDVar2;
LAB_00107ed1:
    iVar5 = 1;
  }
  __PHYSFS_platformReleaseMutex(stateLock);
  return iVar5;
}

Assistant:

static int doMount(PHYSFS_Io *io, const char *fname,
                   const char *mountPoint, int appendToPath)
{
    DirHandle *dh;
    DirHandle *prev = NULL;
    DirHandle *i;

    BAIL_IF(!fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);

    if (mountPoint == NULL)
        mountPoint = "/";

    __PHYSFS_platformGrabMutex(stateLock);

    for (i = searchPath; i != NULL; i = i->next)
    {
        /* already in search path? */
        if ((i->dirName != NULL) && (strcmp(fname, i->dirName) == 0))
            BAIL_MUTEX_ERRPASS(stateLock, 1);
        prev = i;
    } /* for */

    dh = createDirHandle(io, fname, mountPoint, 0);
    BAIL_IF_MUTEX_ERRPASS(!dh, stateLock, 0);

    if (appendToPath)
    {
        if (prev == NULL)
            searchPath = dh;
        else
            prev->next = dh;
    } /* if */
    else
    {
        dh->next = searchPath;
        searchPath = dh;
    } /* else */

    __PHYSFS_platformReleaseMutex(stateLock);
    return 1;
}